

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_pass(REF_GRID ref_grid)

{
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_NODE pRVar1;
  REF_INTERP pRVar2;
  REF_ADJ pRVar3;
  REF_DBL *pRVar4;
  REF_ADAPT pRVar5;
  REF_CELL pRVar6;
  REF_INT neighbor;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  REF_STATUS RVar11;
  long lVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  undefined8 uVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  REF_INT RVar20;
  int iVar21;
  bool bVar22;
  double dVar23;
  REF_BOOL allowed;
  REF_INT node1;
  REF_DBL max_ratio;
  REF_DBL tet_quality;
  REF_DBL min_ratio;
  REF_BOOL geom_face;
  REF_BOOL allowed_1;
  REF_INT node0;
  REF_DBL normdev_orig;
  REF_DBL quality;
  REF_BOOL geom_edge;
  REF_DBL normdev;
  REF_DBL ideal [3];
  REF_DBL original [3];
  REF_BOOL geom_node;
  REF_DBL total_force [3];
  ulong local_188;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  double local_168;
  double local_160;
  double local_158;
  ulong local_150;
  double local_148;
  double local_140;
  double local_138;
  int local_130;
  int local_12c;
  REF_INT local_128 [2];
  undefined8 local_120;
  double local_118;
  int local_10c;
  double local_108;
  REF_CELL local_100;
  undefined8 local_f8;
  double local_f0;
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [3];
  int local_ac;
  REF_DBL local_a8 [15];
  
  ref_geom = ref_grid->geom;
  lVar12 = 0x28;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    lVar12 = 0x50;
  }
  ref_node = ref_grid->node;
  local_100 = *(REF_CELL *)((long)ref_grid->cell + lVar12 + -0x10);
  if (0 < ref_geom->max) {
    lVar12 = 0;
    do {
      if (ref_geom->descr[lVar12 * 6] == 1) {
        uVar8 = ref_geom->descr[lVar12 * 6 + 5];
        uVar7 = ref_geom_is_a(ref_geom,uVar8,0,&local_ac);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x72f,"ref_smooth_pass",(ulong)uVar7,"node check");
          return uVar7;
        }
        if (local_ac == 0) {
          lVar19 = (long)(int)uVar8;
          ref_smooth_local_cell_about(local_100,ref_node,uVar8,(REF_BOOL *)&local_178);
          if (local_178 == 0) {
            ref_node->age[lVar19] = ref_node->age[lVar19] + 1;
          }
          else {
            if (ref_geom->meshlink == (void *)0x0) {
              uVar8 = ref_smooth_geom_edge(ref_grid,uVar8);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x73b,"ref_smooth_pass",(ulong)uVar8,"ideal node for edge");
                return uVar8;
              }
            }
            else {
              if (ref_grid->geom->meshlink == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x35f,"ref_smooth_meshlink_edge_improve","expect meshlink");
                uVar7 = 1;
              }
              else {
                pRVar1 = ref_grid->node;
                pRVar2 = ref_grid->interp;
                if (((int)uVar8 < 0) ||
                   (((pRVar3 = ref_grid->cell[0]->ref_adj, pRVar3->nnode <= (int)uVar8 ||
                     (pRVar3->first[uVar8] == -1)) &&
                    ((pRVar3 = ref_grid->cell[6]->ref_adj, pRVar3->nnode <= (int)uVar8 ||
                     (pRVar3->first[uVar8] == -1)))))) {
                  uVar7 = ref_geom_is_a(ref_grid->geom,uVar8,1,&local_130);
                  if (uVar7 == 0) {
                    uVar7 = 0;
                    if (local_130 != 0) {
                      RVar11 = ref_smooth_edge_neighbors
                                         (ref_grid,uVar8,local_128,(REF_INT *)&local_16c);
                      bVar22 = RVar11 != 0;
                      if (bVar22) {
                        local_168 = (double)CONCAT44(local_168._4_4_,RVar11);
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x36a,"ref_smooth_meshlink_edge_improve",1,"edge nodes");
                        RVar11 = local_168._0_4_;
                      }
                      local_188 = (ulong)bVar22;
                      uVar17 = local_188;
                      local_188._0_4_ = (uint)bVar22;
                      uVar7 = (uint)local_188;
                      if ((RVar11 == 0) && (uVar7 = 0, local_16c != 0xffffffff)) {
                        local_168 = (double)CONCAT44(local_168._4_4_,local_16c);
                        local_a8[0] = 0.0;
                        local_a8[1] = 0.0;
                        local_a8[2] = 0.0;
                        uVar7 = ref_smooth_add_pliant_force(pRVar1,uVar8,local_128[0],local_a8);
                        if (uVar7 == 0) {
                          uVar7 = ref_smooth_add_pliant_force(pRVar1,uVar8,local_168._0_4_,local_a8)
                          ;
                          if (uVar7 == 0) {
                            pRVar4 = pRVar1->real;
                            local_160 = (double)(lVar19 * 0xf);
                            dVar23 = ref_grid->adapt->smooth_pliant_alpha;
                            lVar15 = 0;
                            do {
                              local_e8[lVar15] =
                                   local_a8[lVar15] * dVar23 + pRVar4[lVar19 * 0xf + lVar15];
                              lVar15 = lVar15 + 1;
                            } while (lVar15 != 3);
                            local_c8[2] = pRVar4[lVar19 * 0xf + 2];
                            local_c8[0] = pRVar4[lVar19 * 0xf];
                            local_c8[1] = (pRVar4 + lVar19 * 0xf)[1];
                            uVar7 = ref_smooth_tri_normdev_around
                                              (ref_grid,uVar8,(REF_DBL *)&local_120);
                            if (uVar7 == 0) {
                              local_170 = 0xffffffff;
                              if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
                                local_170 = pRVar2->cell[lVar19];
                              }
                              local_160 = (double)((long)local_160 << 3);
                              iVar21 = 0;
                              local_108 = (double)CONCAT44(local_120._4_4_,(int)local_120);
                              dVar23 = 1.0;
                              local_188 = uVar17;
                              do {
                                local_140 = (double)CONCAT44(local_140._4_4_,iVar21);
                                pRVar4 = pRVar1->real;
                                lVar15 = 0;
                                do {
                                  *(double *)((long)pRVar4 + lVar15 * 8 + (long)local_160) =
                                       local_e8[lVar15] * dVar23 + local_c8[lVar15] * (1.0 - dVar23)
                                  ;
                                  lVar15 = lVar15 + 1;
                                } while (lVar15 != 3);
                                local_168 = dVar23;
                                uVar7 = ref_geom_constrain(ref_grid,uVar8);
                                if (uVar7 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x385,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                         "constrain");
                                  goto LAB_001e5a94;
                                }
                                uVar10 = ref_metric_interpolate_node(ref_grid,uVar8);
                                if ((uVar10 != 0) && (uVar10 != 5)) {
                                  local_150 = CONCAT44(local_150._4_4_,uVar10);
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x387,"ref_smooth_meshlink_edge_improve",(ulong)uVar10,
                                         "ref_metric_interpolate_node failed");
                                  local_188 = local_150 & 0xffffffff;
                                  uVar10 = (uint)local_150;
                                }
                                if (uVar10 != 5) {
                                  uVar7 = (uint)local_188;
                                  if (uVar10 != 0) goto LAB_001e5a94;
                                  local_150 = local_150 & 0xffffffff00000000;
                                  uVar7 = ref_smooth_valid_no_geom_tri(ref_grid,uVar8,&local_12c);
                                  if (uVar7 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x389,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                           "normals");
                                    goto LAB_001e5a94;
                                  }
                                  if (local_12c != 0) {
                                    uVar7 = ref_metric_interpolate_node(ref_grid,uVar8);
                                    if (uVar7 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x38b,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                             "interp node");
                                      goto LAB_001e5a94;
                                    }
                                    uVar7 = ref_smooth_tri_quality_around(ref_grid,uVar8,&local_118)
                                    ;
                                    if (uVar7 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x38c,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                             "q");
                                      goto LAB_001e5a94;
                                    }
                                    uVar7 = ref_smooth_tri_ratio_around
                                                      (ref_grid,uVar8,&local_138,&local_158);
                                    if (uVar7 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x38e,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                             "ratio");
                                      goto LAB_001e5a94;
                                    }
                                    uVar7 = ref_smooth_tri_normdev_around
                                                      (ref_grid,uVar8,(REF_DBL *)&local_f8);
                                    if (uVar7 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x38f,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                             "nd");
                                      goto LAB_001e5a94;
                                    }
                                    pRVar5 = ref_grid->adapt;
                                    if ((((pRVar5->smooth_min_quality <= local_118 &&
                                           local_118 != pRVar5->smooth_min_quality) &&
                                         (pRVar5->post_min_ratio <= local_138)) &&
                                        (local_158 <= pRVar5->post_max_ratio)) &&
                                       ((dVar23 = (double)CONCAT44(local_f8._4_4_,(REF_INT)local_f8)
                                        , pRVar5->post_min_normdev <= dVar23 &&
                                          dVar23 != pRVar5->post_min_normdev || (local_108 < dVar23)
                                        ))) {
                                      uVar10 = 0;
                                      uVar7 = uVar10;
                                      if (((int)uVar8 < 0) ||
                                         ((pRVar3 = ref_grid->cell[8]->ref_adj,
                                          pRVar3->nnode <= (int)uVar8 ||
                                          (pRVar3->first[uVar8] == -1)))) goto LAB_001e5a94;
                                      uVar9 = ref_smooth_tet_quality_around
                                                        (ref_grid,uVar8,&local_148);
                                      if (uVar9 != 0) {
                                        local_f0 = (double)CONCAT44(local_f0._4_4_,uVar9);
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x39a,"ref_smooth_meshlink_edge_improve",
                                               (ulong)uVar9,"q");
                                        local_188 = (ulong)local_f0 & 0xffffffff;
                                        uVar9 = local_f0._0_4_;
                                      }
                                      uVar7 = (uint)local_188;
                                      if (uVar9 != 0) goto LAB_001e5a94;
                                      uVar7 = ref_smooth_tet_ratio_around
                                                        (ref_grid,uVar8,&local_138,&local_158);
                                      if (uVar7 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x39d,"ref_smooth_meshlink_edge_improve",
                                               (ulong)uVar7,"ratio");
                                        goto LAB_001e5a94;
                                      }
                                      pRVar5 = ref_grid->adapt;
                                      if ((pRVar5->smooth_min_quality <= local_148 &&
                                           local_148 != pRVar5->smooth_min_quality) &&
                                         (pRVar5->post_min_ratio <= local_138)) {
                                        uVar7 = uVar10;
                                        uVar10 = (uint)local_150;
                                        if (pRVar5->post_max_ratio < local_158) goto LAB_001e6195;
                                        goto LAB_001e5a94;
                                      }
                                    }
                                  }
                                  uVar10 = (uint)local_150;
                                }
LAB_001e6195:
                                dVar23 = local_168 * 0.5;
                                if ((local_170 != 0xffffffff) && (uVar10 != 0)) {
                                  pRVar2->cell[lVar19] = local_170;
                                }
                                iVar21 = local_140._0_4_ + 1;
                              } while (iVar21 != 8);
                              pRVar4 = pRVar1->real;
                              *(REF_DBL *)((long)pRVar4 + (long)local_160 + 0x10) = local_c8[2];
                              pRVar4 = (REF_DBL *)((long)pRVar4 + (long)local_160);
                              *pRVar4 = local_c8[0];
                              pRVar4[1] = local_c8[1];
                              uVar8 = ref_metric_interpolate_node(ref_grid,uVar8);
                              if ((uVar8 != 0) && (uVar8 != 5)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x3af,"ref_smooth_meshlink_edge_improve",(ulong)uVar8,
                                       "interp");
                                local_188._0_4_ = uVar8;
                              }
                              if ((uVar8 == 5) || (uVar7 = (uint)local_188, uVar8 == 0))
                              goto LAB_001e59b1;
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x378,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                     "nd_orig");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x36f,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,"n1");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x36e,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,"n0");
                        }
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x367,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,"edge check");
                  }
                }
                else {
LAB_001e59b1:
                  uVar7 = 0;
                }
              }
LAB_001e5a94:
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x739,"ref_smooth_pass",(ulong)uVar7,"improve");
                return uVar7;
              }
            }
            ref_node->age[lVar19] = 0;
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < ref_geom->max);
  }
  if (0 < ref_node->max) {
    lVar12 = 0;
    lVar19 = 0;
    do {
      if (-1 < ref_node->global[lVar19]) {
        pRVar3 = ref_grid->cell[0]->ref_adj;
        if (lVar19 < pRVar3->nnode) {
          bVar22 = pRVar3->first[lVar19] != -1;
          local_178 = (uint)bVar22;
          if (bVar22) {
            RVar20 = (REF_INT)lVar19;
            uVar8 = ref_geom_is_a(ref_geom,RVar20,1,&local_10c);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x747,"ref_smooth_pass",(ulong)uVar8,"edge check");
              return uVar8;
            }
            if (local_10c == 0) {
              ref_smooth_local_cell_about(local_100,ref_node,RVar20,(REF_BOOL *)&local_178);
              if (local_178 == 0) {
                ref_node->age[lVar19] = ref_node->age[lVar19] + 1;
              }
              else {
                ref_node->age[lVar19] = 0;
                pRVar3 = ref_grid->cell[0]->ref_adj;
                uVar8 = 0;
                uVar7 = 0;
                if ((lVar19 < pRVar3->nnode) && (pRVar3->first[lVar19] != -1)) {
                  pRVar1 = ref_grid->node;
                  pRVar2 = ref_grid->interp;
                  pRVar3 = ref_grid->cell[6]->ref_adj;
                  if (((((pRVar3->nnode <= lVar19) || (pRVar3->first[lVar19] == -1)) &&
                       ((pRVar3 = ref_grid->cell[9]->ref_adj, uVar8 = uVar7, pRVar3->nnode <= lVar19
                        || (pRVar3->first[lVar19] == -1)))) &&
                      ((pRVar3 = ref_grid->cell[10]->ref_adj, pRVar3->nnode <= lVar19 ||
                       (pRVar3->first[lVar19] == -1)))) &&
                     ((pRVar3 = ref_grid->cell[0xb]->ref_adj, pRVar3->nnode <= lVar19 ||
                      (pRVar3->first[lVar19] == -1)))) {
                    uVar8 = ref_geom_is_a(ref_grid->geom,RVar20,1,(REF_BOOL *)&local_16c);
                    if (uVar8 == 0) {
                      uVar8 = uVar7;
                      if (local_16c == 0) {
                        RVar11 = ref_smooth_edge_neighbors
                                           (ref_grid,RVar20,(REF_INT *)&local_f8,
                                            (REF_INT *)&local_120);
                        if (RVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x309,"ref_smooth_no_geom_edge_improve",1,"edge nodes");
                        }
                        neighbor = (REF_INT)local_f8;
                        uVar10 = (uint)(RVar11 != 0);
                        uVar8 = uVar10;
                        if ((RVar11 == 0) && (uVar8 = uVar7, (int)local_120 != -1)) {
                          local_168 = (double)CONCAT44(local_168._4_4_,(int)local_120);
                          uVar8 = ref_smooth_node_same_tangent
                                            (ref_grid,RVar20,(REF_INT)local_f8,(int)local_120,
                                             local_128);
                          if (uVar8 == 0) {
                            uVar8 = uVar7;
                            if (local_128[0] != 0) {
                              local_a8[0] = 0.0;
                              local_a8[1] = 0.0;
                              local_a8[2] = 0.0;
                              uVar8 = ref_smooth_add_pliant_force(pRVar1,RVar20,neighbor,local_a8);
                              if (uVar8 == 0) {
                                uVar8 = ref_smooth_add_pliant_force
                                                  (pRVar1,RVar20,local_168._0_4_,local_a8);
                                if (uVar8 == 0) {
                                  pRVar4 = pRVar1->real;
                                  dVar23 = ref_grid->adapt->smooth_pliant_alpha;
                                  lVar15 = 0;
                                  do {
                                    local_e8[lVar15] =
                                         local_a8[lVar15] * dVar23 +
                                         *(double *)((long)pRVar4 + lVar15 * 8 + lVar12);
                                    lVar15 = lVar15 + 1;
                                  } while (lVar15 != 3);
                                  local_150 = lVar19 * 0x78;
                                  local_c8[2] = pRVar4[lVar19 * 0xf + 2];
                                  local_c8[0] = pRVar4[lVar19 * 0xf];
                                  local_c8[1] = (pRVar4 + lVar19 * 0xf)[1];
                                  local_140 = (double)CONCAT44(local_140._4_4_,0xffffffff);
                                  if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
                                    local_140 = (double)CONCAT44(local_140._4_4_,
                                                                 pRVar2->cell[lVar19]);
                                  }
                                  iVar21 = 0;
                                  dVar23 = 1.0;
                                  do {
                                    pRVar4 = pRVar1->real;
                                    lVar15 = 0;
                                    do {
                                      *(double *)((long)pRVar4 + lVar15 * 8 + lVar12) =
                                           local_e8[lVar15] * dVar23 +
                                           local_c8[lVar15] * (1.0 - dVar23);
                                      lVar15 = lVar15 + 1;
                                    } while (lVar15 != 3);
                                    local_168 = (double)CONCAT44(local_168._4_4_,iVar21);
                                    uVar7 = ref_metric_interpolate_node(ref_grid,RVar20);
                                    if ((uVar7 != 0) && (uVar7 != 5)) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x327,"ref_smooth_no_geom_edge_improve",(ulong)uVar7,
                                             "ref_metric_interpolate_node failed");
                                      uVar10 = uVar7;
                                    }
                                    if (uVar7 == 5) {
                                      iVar21 = 5;
                                    }
                                    else {
                                      local_160 = (double)CONCAT44(local_160._4_4_,uVar7);
                                      uVar8 = uVar10;
                                      if (uVar7 != 0) goto LAB_001e6502;
                                      uVar8 = ref_smooth_valid_no_geom_tri
                                                        (ref_grid,RVar20,local_128);
                                      if (uVar8 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x329,"ref_smooth_no_geom_edge_improve",(ulong)uVar8
                                               ,"normals");
                                        goto LAB_001e6502;
                                      }
                                      if (local_128[0] != 0) {
                                        uVar8 = ref_metric_interpolate_node(ref_grid,RVar20);
                                        if (uVar8 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                 ,0x32b,"ref_smooth_no_geom_edge_improve",
                                                 (ulong)uVar8,"interp node");
                                          goto LAB_001e6502;
                                        }
                                        uVar8 = ref_smooth_tri_quality_around
                                                          (ref_grid,RVar20,&local_118);
                                        if (uVar8 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                 ,0x32c,"ref_smooth_no_geom_edge_improve",
                                                 (ulong)uVar8,"q");
                                          goto LAB_001e6502;
                                        }
                                        uVar8 = ref_smooth_tri_ratio_around
                                                          (ref_grid,RVar20,&local_138,&local_158);
                                        if (uVar8 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                 ,0x32e,"ref_smooth_no_geom_edge_improve",
                                                 (ulong)uVar8,"ratio");
                                          goto LAB_001e6502;
                                        }
                                        pRVar5 = ref_grid->adapt;
                                        if (((pRVar5->smooth_min_quality <= local_118 &&
                                              local_118 != pRVar5->smooth_min_quality) &&
                                            (pRVar5->post_min_ratio <= local_138)) &&
                                           (local_158 <= pRVar5->post_max_ratio)) {
                                          pRVar3 = ref_grid->cell[8]->ref_adj;
                                          uVar8 = 0;
                                          if ((pRVar3->nnode <= lVar19) ||
                                             (pRVar3->first[lVar19] == -1)) goto LAB_001e6502;
                                          uVar8 = ref_smooth_tet_quality_around
                                                            (ref_grid,RVar20,&local_148);
                                          if (uVar8 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x336,"ref_smooth_no_geom_edge_improve",
                                                  (ulong)uVar8,"q");
                                            goto LAB_001e6502;
                                          }
                                          uVar8 = ref_smooth_tet_ratio_around
                                                            (ref_grid,RVar20,&local_138,&local_158);
                                          if (uVar8 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x339,"ref_smooth_no_geom_edge_improve",
                                                  (ulong)uVar8,"ratio");
                                            goto LAB_001e6502;
                                          }
                                          pRVar5 = ref_grid->adapt;
                                          if ((pRVar5->smooth_min_quality <= local_148 &&
                                               local_148 != pRVar5->smooth_min_quality) &&
                                             (pRVar5->post_min_ratio <= local_138)) {
                                            uVar8 = 0;
                                            iVar21 = local_160._0_4_;
                                            if (pRVar5->post_max_ratio < local_158)
                                            goto LAB_001e6aac;
                                            goto LAB_001e6502;
                                          }
                                        }
                                      }
                                      iVar21 = local_160._0_4_;
                                    }
LAB_001e6aac:
                                    dVar23 = dVar23 * 0.5;
                                    if (iVar21 != 0 && local_140._0_4_ != -1) {
                                      pRVar2->cell[lVar19] = local_140._0_4_;
                                    }
                                    iVar21 = local_168._0_4_ + 1;
                                  } while (iVar21 != 8);
                                  pRVar4 = pRVar1->real;
                                  *(REF_DBL *)((long)pRVar4 + local_150 + 0x10) = local_c8[2];
                                  pRVar4 = (REF_DBL *)((long)pRVar4 + local_150);
                                  *pRVar4 = local_c8[0];
                                  pRVar4[1] = local_c8[1];
                                  uVar7 = ref_metric_interpolate_node(ref_grid,RVar20);
                                  if ((uVar7 != 0) && (uVar7 != 5)) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x34b,"ref_smooth_no_geom_edge_improve",(ulong)uVar7,
                                           "interp");
                                    uVar10 = uVar7;
                                  }
                                  if ((uVar7 == 5) || (uVar8 = uVar10, uVar7 == 0)) {
                                    uVar8 = 0;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x311,"ref_smooth_no_geom_edge_improve",(ulong)uVar8,"n1")
                                  ;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x310,"ref_smooth_no_geom_edge_improve",(ulong)uVar8,"n0");
                              }
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x30c,"ref_smooth_no_geom_edge_improve",uVar8,"tan");
                          }
                        }
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x306,"ref_smooth_no_geom_edge_improve",(ulong)uVar8,"edge check");
                    }
                  }
                }
LAB_001e6502:
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x752,"ref_smooth_pass",(ulong)uVar8,"improve");
                  return uVar8;
                }
              }
            }
          }
        }
        else {
          local_178 = 0;
        }
      }
      lVar19 = lVar19 + 1;
      lVar12 = lVar12 + 0x78;
    } while (lVar19 < ref_node->max);
  }
  if (0 < ref_grid->adapt->timing_level) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"mov edge");
  }
  if (0 < ref_geom->max) {
    lVar12 = 0;
    do {
      if (ref_geom->descr[lVar12 * 6] == 2) {
        uVar8 = ref_geom->descr[lVar12 * 6 + 5];
        uVar7 = ref_geom_is_a(ref_geom,uVar8,1,&local_10c);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x75e,"ref_smooth_pass",(ulong)uVar7,"edge check");
          return uVar7;
        }
        if (local_10c == 0) {
          lVar19 = (long)(int)uVar8;
          ref_smooth_local_cell_about(local_100,ref_node,uVar8,(REF_BOOL *)&local_178);
          if (local_178 == 0) {
            ref_node->age[lVar19] = ref_node->age[lVar19] + 1;
          }
          else {
            if (ref_geom->meshlink == (void *)0x0) {
              uVar10 = ref_smooth_geom_face(ref_grid,uVar8);
              if (uVar10 != 0) {
                uVar16 = 0x76a;
                pcVar18 = "ideal node for face";
LAB_001e6e55:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,uVar16,"ref_smooth_pass",(ulong)uVar10,pcVar18);
                local_174 = uVar10;
              }
            }
            else {
              if (ref_grid->geom->meshlink == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x478,"ref_smooth_meshlink_face_improve","expect meshlink");
                uVar10 = 1;
              }
              else {
                pRVar1 = ref_grid->node;
                pRVar2 = ref_grid->interp;
                if (((int)uVar8 < 0) ||
                   (((pRVar3 = ref_grid->cell[6]->ref_adj, pRVar3->nnode <= (int)uVar8 ||
                     (pRVar3->first[uVar8] == -1)) &&
                    ((pRVar3 = ref_grid->cell[0]->ref_adj, pRVar3->nnode <= (int)uVar8 ||
                     (pRVar3->first[uVar8] == -1)))))) {
                  uVar7 = ref_cell_id_list_around
                                    (ref_grid->cell[3],uVar8,2,(REF_INT *)&local_16c,local_128);
                  if ((uVar7 == 0) || (uVar7 == 7)) {
                    uVar10 = 0;
                    if ((int)local_16c < 2) {
                      uVar9 = ref_geom_is_a(ref_grid->geom,uVar8,2,&local_130);
                      if (uVar9 != 0) {
                        local_168 = (double)CONCAT44(local_168._4_4_,uVar9);
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x486,"ref_smooth_meshlink_face_improve",(ulong)uVar9,"face check");
                        uVar9 = local_168._0_4_;
                        uVar7 = local_168._0_4_;
                      }
                      uVar10 = uVar7;
                      if ((uVar9 == 0) && (uVar10 = 0, local_130 != 0)) {
                        local_168 = (double)(lVar19 * 0xf);
                        local_e8[2] = pRVar1->real[lVar19 * 0xf + 2];
                        pRVar4 = pRVar1->real + lVar19 * 0xf;
                        local_e8[0] = *pRVar4;
                        local_e8[1] = pRVar4[1];
                        RVar20 = -1;
                        if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
                          RVar20 = pRVar2->cell[lVar19];
                        }
                        local_140 = (double)CONCAT44(local_140._4_4_,RVar20);
                        uVar10 = ref_smooth_tri_quality_around(ref_grid,uVar8,local_c8);
                        if (uVar10 == 0) {
                          uVar10 = ref_smooth_tri_normdev_around
                                             (ref_grid,uVar8,(REF_DBL *)&local_120);
                          if (uVar10 == 0) {
                            uVar10 = ref_smooth_tri_ratio_around
                                               (ref_grid,uVar8,&local_158,&local_148);
                            if (uVar10 == 0) {
                              local_108 = local_c8[0];
                              if (((local_c8[0] < 0.5) || (local_158 < 0.5)) || (2.0 < local_148)) {
                                uVar9 = ref_smooth_tri_weighted_ideal(ref_grid,uVar8,local_a8);
                                if (uVar9 != 0) {
                                  uVar16 = 0x498;
                                  uVar7 = uVar9;
                                  goto LAB_001e707c;
                                }
                              }
                              else {
                                uVar9 = ref_smooth_tri_pliant(ref_grid,uVar8,local_a8);
                                if (uVar9 != 0) {
                                  uVar16 = 0x49a;
                                  uVar7 = uVar9;
LAB_001e707c:
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,uVar16,"ref_smooth_meshlink_face_improve",(ulong)uVar7,
                                         "ideal");
                                  uVar9 = uVar7;
                                }
                              }
                              uVar10 = uVar7;
                              if (uVar9 == 0) {
                                local_168 = (double)((long)local_168 << 3);
                                iVar21 = 0;
                                local_f0 = (double)CONCAT44(local_120._4_4_,(int)local_120);
                                dVar23 = 1.0;
                                do {
                                  local_150 = CONCAT44(local_150._4_4_,iVar21);
                                  pRVar4 = pRVar1->real;
                                  lVar15 = 0;
                                  do {
                                    *(double *)((long)pRVar4 + lVar15 * 8 + (long)local_168) =
                                         local_a8[lVar15] * dVar23 +
                                         local_e8[lVar15] * (1.0 - dVar23);
                                    lVar15 = lVar15 + 1;
                                  } while (lVar15 != 3);
                                  local_160 = dVar23;
                                  uVar10 = ref_geom_constrain(ref_grid,uVar8);
                                  if (uVar10 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x4a2,"ref_smooth_meshlink_face_improve",(ulong)uVar10,
                                           "constrain");
                                    goto LAB_001e6e2d;
                                  }
                                  uVar9 = ref_metric_interpolate_node(ref_grid,uVar8);
                                  if ((uVar9 != 0) && (uVar9 != 5)) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x4a4,"ref_smooth_meshlink_face_improve",(ulong)uVar9,
                                           "ref_metric_interpolate_node failed");
                                    uVar7 = uVar9;
                                  }
                                  if (uVar9 != 5) {
                                    uVar10 = uVar7;
                                    local_170 = uVar9;
                                    if (uVar9 != 0) goto LAB_001e6e2d;
                                    uVar10 = ref_smooth_valid_no_geom_tri(ref_grid,uVar8,&local_12c)
                                    ;
                                    if (uVar10 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x4a6,"ref_smooth_meshlink_face_improve",(ulong)uVar10
                                             ,"twod tri");
                                      goto LAB_001e6e2d;
                                    }
                                    uVar10 = ref_smooth_tri_quality_around
                                                       (ref_grid,uVar8,&local_118);
                                    if (uVar10 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x4a7,"ref_smooth_meshlink_face_improve",(ulong)uVar10
                                             ,"q");
                                      goto LAB_001e6e2d;
                                    }
                                    uVar10 = ref_smooth_tri_normdev_around
                                                       (ref_grid,uVar8,(REF_DBL *)&local_f8);
                                    if (uVar10 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x4a8,"ref_smooth_meshlink_face_improve",(ulong)uVar10
                                             ,"nd");
                                      goto LAB_001e6e2d;
                                    }
                                    uVar10 = ref_smooth_tri_ratio_around
                                                       (ref_grid,uVar8,&local_158,&local_148);
                                    if (uVar10 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x4aa,"ref_smooth_meshlink_face_improve",(ulong)uVar10
                                             ,"ratio");
                                      goto LAB_001e6e2d;
                                    }
                                    uVar9 = local_170;
                                    if ((((local_12c != 0) && (local_108 < local_118)) &&
                                        ((pRVar5 = ref_grid->adapt,
                                         pRVar5->post_min_ratio <= local_158 &&
                                         (local_148 <= pRVar5->post_max_ratio)))) &&
                                       ((dVar23 = (double)CONCAT44(local_f8._4_4_,(REF_INT)local_f8)
                                        , pRVar5->post_min_normdev <= dVar23 &&
                                          dVar23 != pRVar5->post_min_normdev || (local_f0 < dVar23))
                                       )) {
                                      uVar10 = 0;
                                      if (((int)uVar8 < 0) ||
                                         ((pRVar3 = ref_grid->cell[8]->ref_adj,
                                          pRVar3->nnode <= (int)uVar8 ||
                                          (pRVar3->first[uVar8] == -1)))) goto LAB_001e6e2d;
                                      uVar10 = ref_smooth_tet_quality_around
                                                         (ref_grid,uVar8,&local_138);
                                      if (uVar10 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x4b3,"ref_smooth_meshlink_face_improve",
                                               (ulong)uVar10,"q");
                                        goto LAB_001e6e2d;
                                      }
                                      uVar10 = ref_smooth_tet_ratio_around
                                                         (ref_grid,uVar8,&local_158,&local_148);
                                      if (uVar10 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x4b6,"ref_smooth_meshlink_face_improve",
                                               (ulong)uVar10,"ratio");
                                        goto LAB_001e6e2d;
                                      }
                                      pRVar5 = ref_grid->adapt;
                                      uVar9 = local_170;
                                      if (((pRVar5->smooth_min_quality <= local_138 &&
                                            local_138 != pRVar5->smooth_min_quality) &&
                                          (pRVar5->post_min_ratio <= local_158)) &&
                                         (uVar10 = 0, local_148 <= pRVar5->post_max_ratio))
                                      goto LAB_001e6e2d;
                                    }
                                  }
                                  dVar23 = local_160 * 0.5;
                                  if ((local_140._0_4_ != -1) && (uVar9 != 0)) {
                                    pRVar2->cell[lVar19] = local_140._0_4_;
                                  }
                                  iVar21 = (uint)local_150 + 1;
                                } while (iVar21 != 8);
                                pRVar4 = pRVar1->real;
                                *(REF_DBL *)((long)pRVar4 + (long)local_168 + 0x10) = local_e8[2];
                                pRVar4 = (REF_DBL *)((long)pRVar4 + (long)local_168);
                                *pRVar4 = local_e8[0];
                                pRVar4[1] = local_e8[1];
                                uVar8 = ref_metric_interpolate_node(ref_grid,uVar8);
                                if ((uVar8 != 0) && (uVar8 != 5)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x4c7,"ref_smooth_meshlink_face_improve",(ulong)uVar8,
                                         "interp");
                                  uVar7 = uVar8;
                                }
                                if ((uVar8 == 5) || (uVar10 = uVar7, uVar8 == 0)) goto LAB_001e6cd7;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x495,"ref_smooth_meshlink_face_improve",(ulong)uVar10,"ratio"
                                    );
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x493,"ref_smooth_meshlink_face_improve",(ulong)uVar10,"nd_orig"
                                  );
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x492,"ref_smooth_meshlink_face_improve",(ulong)uVar10,"q");
                        }
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x481,"ref_smooth_meshlink_face_improve",(ulong)uVar7,"count faceids");
                    uVar10 = uVar7;
                  }
                }
                else {
LAB_001e6cd7:
                  uVar10 = 0;
                }
              }
LAB_001e6e2d:
              if (uVar10 != 0) {
                uVar16 = 0x768;
                pcVar18 = "improve";
                goto LAB_001e6e55;
              }
            }
            if (uVar10 != 0) {
              return local_174;
            }
            ref_node->age[lVar19] = 0;
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < ref_geom->max);
  }
  if (0 < ref_node->max) {
    lVar12 = 0;
    lVar19 = 0;
    do {
      if ((-1 < ref_node->global[lVar19]) &&
         ((pRVar3 = ref_grid->cell[0]->ref_adj, pRVar3->nnode <= lVar19 ||
          (bVar22 = pRVar3->first[lVar19] == -1, local_178 = (uint)bVar22, bVar22)))) {
        pRVar3 = ref_grid->cell[3]->ref_adj;
        if (lVar19 < pRVar3->nnode) {
          bVar22 = pRVar3->first[lVar19] != -1;
          local_178 = (uint)bVar22;
          if (bVar22) {
            RVar20 = (REF_INT)lVar19;
            uVar8 = ref_geom_is_a(ref_geom,RVar20,2,&local_130);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x77a,"ref_smooth_pass",(ulong)uVar8,"face check");
              return uVar8;
            }
            if (local_130 == 0) {
              ref_smooth_local_cell_about(local_100,ref_node,RVar20,(REF_BOOL *)&local_178);
              if (local_178 == 0) {
                ref_node->age[lVar19] = ref_node->age[lVar19] + 1;
              }
              else {
                pRVar1 = ref_grid->node;
                pRVar2 = ref_grid->interp;
                pRVar3 = ref_grid->cell[6]->ref_adj;
                if (((((lVar19 < pRVar3->nnode) && (pRVar3->first[lVar19] != -1)) ||
                     ((pRVar3 = ref_grid->cell[9]->ref_adj, lVar19 < pRVar3->nnode &&
                      (pRVar3->first[lVar19] != -1)))) ||
                    (((pRVar3 = ref_grid->cell[10]->ref_adj, lVar19 < pRVar3->nnode &&
                      (pRVar3->first[lVar19] != -1)) ||
                     ((pRVar3 = ref_grid->cell[0xb]->ref_adj, lVar19 < pRVar3->nnode &&
                      (pRVar3->first[lVar19] != -1)))))) ||
                   ((pRVar3 = ref_grid->cell[0]->ref_adj, lVar19 < pRVar3->nnode &&
                    (pRVar3->first[lVar19] != -1)))) {
LAB_001e771d:
                  uVar7 = 0;
                }
                else {
                  uVar8 = ref_cell_id_list_around
                                    (ref_grid->cell[3],RVar20,2,(REF_INT *)&local_120,
                                     (REF_INT *)&local_f8);
                  if ((uVar8 == 0) || (uVar8 == 7)) {
                    uVar7 = 0;
                    if ((int)local_120 < 2) {
                      uVar10 = ref_geom_is_a(ref_grid->geom,RVar20,2,&local_12c);
                      if (uVar10 == 0) {
                        if (local_12c == 0) {
                          uVar10 = ref_smooth_node_same_normal(ref_grid,RVar20,local_128);
                          if (uVar10 == 0) {
                            if (local_128[0] != 0) {
                              local_168 = (double)(lVar19 * 0x78);
                              local_e8[2] = pRVar1->real[lVar19 * 0xf + 2];
                              pRVar4 = pRVar1->real + lVar19 * 0xf;
                              local_e8[0] = *pRVar4;
                              local_e8[1] = pRVar4[1];
                              iVar21 = -1;
                              if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
                                iVar21 = pRVar2->cell[lVar19];
                              }
                              uVar7 = ref_smooth_tri_quality_around(ref_grid,RVar20,local_c8);
                              if (uVar7 == 0) {
                                uVar7 = ref_smooth_tri_ratio_around
                                                  (ref_grid,RVar20,&local_158,&local_148);
                                uVar17 = local_150;
                                if (uVar7 == 0) {
                                  local_150 = local_150 & 0xffffffff00000000;
                                  local_108 = local_c8[0];
                                  if ((0.5 < local_c8[0]) && (0.5 < local_158)) {
                                    local_150._4_4_ = SUB84(uVar17,4);
                                    local_150 = CONCAT44(local_150._4_4_,(uint)(local_148 < 2.0));
                                  }
                                  if ((char)local_150 == '\0') {
                                    uVar10 = ref_smooth_tri_weighted_ideal(ref_grid,RVar20,local_a8)
                                    ;
                                    if (uVar10 != 0) {
                                      uVar16 = 0x431;
                                      goto LAB_001e7a8a;
                                    }
                                  }
                                  else {
                                    uVar10 = ref_smooth_tri_pliant(ref_grid,RVar20,local_a8);
                                    if (uVar10 != 0) {
                                      uVar16 = 0x42f;
LAB_001e7a8a:
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,uVar16,"ref_smooth_no_geom_tri_improve",(ulong)uVar10,
                                             "ideal");
                                      uVar8 = uVar10;
                                    }
                                  }
                                  uVar7 = uVar8;
                                  if (uVar10 == 0) {
                                    local_f0 = local_108 * 0.9;
                                    iVar14 = 0;
                                    dVar23 = 1.0;
                                    do {
                                      local_160 = (double)CONCAT44(local_160._4_4_,iVar14);
                                      pRVar4 = pRVar1->real;
                                      lVar15 = 0;
                                      do {
                                        *(double *)((long)pRVar4 + lVar15 * 8 + lVar12) =
                                             local_a8[lVar15] * dVar23 +
                                             local_e8[lVar15] * (1.0 - dVar23);
                                        lVar15 = lVar15 + 1;
                                      } while (lVar15 != 3);
                                      local_140 = dVar23;
                                      uVar10 = ref_metric_interpolate_node(ref_grid,RVar20);
                                      if ((uVar10 != 0) && (uVar10 != 5)) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x43a,"ref_smooth_no_geom_tri_improve",(ulong)uVar10
                                               ,"ref_metric_interpolate_node failed");
                                        uVar8 = uVar10;
                                      }
                                      if (uVar10 != 5) {
                                        uVar7 = uVar8;
                                        local_170 = uVar10;
                                        if (uVar10 != 0) goto LAB_001e771f;
                                        uVar7 = ref_smooth_tri_quality_around
                                                          (ref_grid,RVar20,&local_118);
                                        if (uVar7 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                 ,0x43c,"ref_smooth_no_geom_tri_improve",
                                                 (ulong)uVar7,"q");
                                          goto LAB_001e771f;
                                        }
                                        uVar7 = ref_smooth_tri_ratio_around
                                                          (ref_grid,RVar20,&local_158,&local_148);
                                        if (uVar7 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                 ,0x43e,"ref_smooth_no_geom_tri_improve",
                                                 (ulong)uVar7,"ratio");
                                          goto LAB_001e771f;
                                        }
                                        uVar7 = ref_smooth_valid_no_geom_tri
                                                          (ref_grid,RVar20,(REF_BOOL *)&local_16c);
                                        if (uVar7 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                 ,0x440,"ref_smooth_no_geom_tri_improve",
                                                 (ulong)uVar7,"twod tri");
                                          goto LAB_001e771f;
                                        }
                                        if ((local_16c == 0) ||
                                           (local_158 < ref_grid->adapt->post_min_ratio)) {
                                          bVar22 = false;
                                        }
                                        else {
                                          bVar22 = local_148 <= ref_grid->adapt->post_max_ratio;
                                        }
                                        dVar23 = local_108;
                                        if ((char)local_150 != '\0') {
                                          bVar22 = (bool)(bVar22 & local_f0 < local_118);
                                          dVar23 = 0.4;
                                        }
                                        bVar13 = dVar23 < local_118 & bVar22;
                                        local_16c = (uint)bVar13;
                                        uVar10 = local_170;
                                        if (bVar13 == 1) {
                                          pRVar3 = ref_grid->cell[8]->ref_adj;
                                          uVar7 = 0;
                                          if ((pRVar3->nnode <= lVar19) ||
                                             (pRVar3->first[lVar19] == -1)) goto LAB_001e771f;
                                          uVar7 = ref_smooth_tet_quality_around
                                                            (ref_grid,RVar20,&local_138);
                                          if (uVar7 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x451,"ref_smooth_no_geom_tri_improve",
                                                  (ulong)uVar7,"q");
                                            goto LAB_001e771f;
                                          }
                                          uVar7 = ref_smooth_tet_ratio_around
                                                            (ref_grid,RVar20,&local_158,&local_148);
                                          if (uVar7 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x454,"ref_smooth_no_geom_tri_improve",
                                                  (ulong)uVar7,"ratio");
                                            goto LAB_001e771f;
                                          }
                                          pRVar5 = ref_grid->adapt;
                                          uVar10 = local_170;
                                          if (((pRVar5->smooth_min_quality <= local_138 &&
                                                local_138 != pRVar5->smooth_min_quality) &&
                                              (pRVar5->post_min_ratio <= local_158)) &&
                                             (uVar7 = 0, local_148 <= pRVar5->post_max_ratio))
                                          goto LAB_001e771f;
                                        }
                                      }
                                      dVar23 = local_140 * 0.5;
                                      if (uVar10 != 0 && iVar21 != -1) {
                                        pRVar2->cell[lVar19] = iVar21;
                                      }
                                      iVar14 = local_160._0_4_ + 1;
                                    } while (iVar14 != 8);
                                    pRVar4 = pRVar1->real;
                                    *(REF_DBL *)((long)pRVar4 + (long)local_168 + 0x10) =
                                         local_e8[2];
                                    pRVar4 = (REF_DBL *)((long)pRVar4 + (long)local_168);
                                    *pRVar4 = local_e8[0];
                                    pRVar4[1] = local_e8[1];
                                    uVar10 = ref_metric_interpolate_node(ref_grid,RVar20);
                                    uVar7 = uVar8;
                                    if ((uVar10 != 0) && (uVar10 != 5)) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x465,"ref_smooth_no_geom_tri_improve",(ulong)uVar10,
                                             "interp");
                                      uVar7 = uVar10;
                                    }
                                    if ((uVar10 == 5) || (uVar10 == 0)) goto LAB_001e771d;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x42b,"ref_smooth_no_geom_tri_improve",(ulong)uVar7,
                                         "ratio");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x429,"ref_smooth_no_geom_tri_improve",(ulong)uVar7,"q");
                              }
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x41d,"ref_smooth_no_geom_tri_improve",uVar10,"normal dev");
                            uVar7 = uVar10;
                          }
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x41a,"ref_smooth_no_geom_tri_improve",uVar10,"face check");
                        uVar7 = uVar10;
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x415,"ref_smooth_no_geom_tri_improve",(ulong)uVar8,"count faceids");
                    uVar7 = uVar8;
                  }
                }
LAB_001e771f:
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x783,"ref_smooth_pass",(ulong)uVar7,"no geom smooth");
                  return uVar7;
                }
              }
            }
          }
        }
        else {
          local_178 = 0;
        }
      }
      lVar19 = lVar19 + 1;
      lVar12 = lVar12 + 0x78;
    } while (lVar19 < ref_node->max);
  }
  if (0 < ref_grid->adapt->timing_level) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"mov face");
  }
  if (0 < ref_node->max) {
    pRVar6 = ref_grid->cell[8];
    lVar12 = 0;
    do {
      if (-1 < ref_node->global[lVar12]) {
        ref_smooth_local_cell_about(pRVar6,ref_node,(REF_INT)lVar12,(REF_BOOL *)&local_178);
        if (local_178 == 0) {
          ref_node->age[lVar12] = ref_node->age[lVar12] + 1;
        }
        else {
          pRVar3 = ref_grid->cell[3]->ref_adj;
          if ((((pRVar3->nnode <= lVar12) || (pRVar3->first[lVar12] == -1)) &&
              ((pRVar3 = ref_grid->cell[6]->ref_adj, pRVar3->nnode <= lVar12 ||
               (pRVar3->first[lVar12] == -1)))) &&
             ((pRVar3 = ref_grid->cell[8]->ref_adj, lVar12 < pRVar3->nnode &&
              (pRVar3->first[lVar12] != -1)))) {
            uVar8 = ref_smooth_tet_improve(ref_grid,(REF_INT)lVar12);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x79a,"ref_smooth_pass",(ulong)uVar8,"ideal tet node");
              return uVar8;
            }
            ref_node->age[lVar12] = 0;
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < ref_node->max);
  }
  if (0 < ref_grid->adapt->timing_level) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"mov int");
  }
  if (ref_grid->surf == 0) {
    pRVar6 = ref_grid->cell[8];
    uVar17 = (ulong)(0 < pRVar6->max);
    if (0 < pRVar6->max) {
      iVar21 = 0;
      do {
        RVar11 = ref_cell_nodes(pRVar6,iVar21,(REF_INT *)local_a8);
        if (RVar11 == 0) {
          uVar8 = ref_node_tet_quality(ref_node,(REF_INT *)local_a8,local_e8);
          if (uVar8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x7ab,"ref_smooth_pass",(ulong)uVar8,"qual");
            local_174 = uVar8;
            break;
          }
          if ((local_e8[0] < 0.1) && (0 < pRVar6->node_per)) {
            local_100 = (REF_CELL)CONCAT71(local_100._1_7_,(char)uVar17);
            lVar12 = 0;
            do {
              uVar8 = *(uint *)((long)local_a8 + lVar12 * 4);
              ref_smooth_local_cell_about(pRVar6,ref_node,uVar8,(REF_BOOL *)&local_178);
              if (local_178 == 0) {
                ref_node->age[(int)uVar8] = ref_node->age[(int)uVar8] + 1;
              }
              else if (((int)uVar8 < 0) ||
                      (((pRVar3 = ref_grid->cell[3]->ref_adj, pRVar3->nnode <= (int)uVar8 ||
                        (pRVar3->first[uVar8] == -1)) &&
                       ((pRVar3 = ref_grid->cell[6]->ref_adj, pRVar3->nnode <= (int)uVar8 ||
                        (pRVar3->first[uVar8] == -1)))))) {
                uVar7 = ref_smooth_tet_improve(ref_grid,uVar8);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x7b9,"ref_smooth_pass",(ulong)uVar7,"ideal");
                  uVar17 = (ulong)local_100 & 0xff;
                  local_174 = uVar7;
                  goto LAB_001e8214;
                }
                ref_node->age[(int)uVar8] = 0;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < pRVar6->node_per);
          }
        }
        iVar21 = iVar21 + 1;
        uVar17 = (ulong)(iVar21 < pRVar6->max);
      } while (iVar21 < pRVar6->max);
    }
LAB_001e8214:
    if ((uVar17 & 1) != 0) {
      return local_174;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_pass(REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom, node;
  REF_BOOL allowed, geom_node, geom_edge, geom_face, interior;
  REF_BOOL vol_val = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol start");

  /* smooth edges first if we have geom */
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    /* don't move geom nodes */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
    if (geom_node) continue;
    /* next to ghost node, can't move */
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_smooth_meshlink_edge_improve(ref_grid, node), "improve");
    } else {
      RSS(ref_smooth_geom_edge(ref_grid, node), "ideal node for edge");
    }
    ref_node_age(ref_node, node) = 0;
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol geom edge");

  /* smooth edges first without geom, for 2D */
  each_ref_node_valid_node(ref_node, node) {
    /* boundaries only */
    allowed = !ref_cell_node_empty(ref_grid_edg(ref_grid), node);
    if (!allowed) continue;
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
    if (geom_edge) continue;

    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }

    ref_node_age(ref_node, node) = 0;
    RSS(ref_smooth_no_geom_edge_improve(ref_grid, node), "improve");
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol nogeom edge");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov edge");

  /* smooth faces if we have geom, but skip edges */
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    /* don't move geom nodes */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
    if (geom_edge) continue;
    /* next to ghost node, can't move */
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_smooth_meshlink_face_improve(ref_grid, node), "improve");
    } else {
      RSS(ref_smooth_geom_face(ref_grid, node), "ideal node for face");
    }
    ref_node_age(ref_node, node) = 0;
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol face geom");

  /* smooth faces without geom */
  each_ref_node_valid_node(ref_node, node) {
    /* avoid edges */
    allowed = ref_cell_node_empty(ref_grid_edg(ref_grid), node);
    if (!allowed) continue;
    /* need tri to smooth */
    allowed = !ref_cell_node_empty(ref_grid_tri(ref_grid), node);
    if (!allowed) continue;
    /* avoid geometry faces (or edges) */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face check");
    if (geom_face) continue;

    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    RSS(ref_smooth_no_geom_tri_improve(ref_grid, node), "no geom smooth");
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol face nogeom");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov face");

  /* smooth interior */
  ref_cell = ref_grid_tet(ref_grid);

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }

    interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
               ref_cell_node_empty(ref_grid_qua(ref_grid), node) &&
               !ref_cell_node_empty(ref_grid_tet(ref_grid), node);
    if (interior) {
      RSS(ref_smooth_tet_improve(ref_grid, node), "ideal tet node");
      ref_node_age(ref_node, node) = 0;
    }
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol int");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov int");

  /* smooth low quality tets */
  ref_cell = ref_grid_tet(ref_grid);

  if (!ref_grid_surf(ref_grid)) {
    REF_DBL quality, min_quality = 0.10;
    REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
      if (quality < min_quality) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          node = nodes[cell_node];
          RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
              "para");
          if (!allowed) {
            ref_node_age(ref_node, node)++;
            continue;
          }

          interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
                     ref_cell_node_empty(ref_grid_qua(ref_grid), node);
          if (interior) {
            RSS(ref_smooth_tet_improve(ref_grid, node), "ideal");
            ref_node_age(ref_node, node) = 0;
          }
        }
      }
    }
    if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol about");
  }
  return REF_SUCCESS;
}